

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextProfiler::Initialize
          (ScriptContextProfiler *this,PageAllocator *pageAllocator,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  ArenaAllocator *pAVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  Profiler *pPVar6;
  PageAllocator *pPVar7;
  TrackAllocData local_d8;
  code *local_b0;
  undefined8 local_a8;
  TrackAllocData local_a0;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler_local;
  PageAllocator *pageAllocator_local;
  ScriptContextProfiler *this_local;
  
  local_20 = recycler;
  recycler_local = (Recycler *)pageAllocator;
  pageAllocator_local = (PageAllocator *)this;
  bVar2 = IsInitialized(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextProfiler.cpp"
                                ,0x29,"(!IsInitialized())","!IsInitialized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&Memory::ArenaAllocator::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextProfiler.cpp"
             ,0x2a);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  local_58 = Memory::HeapAllocator::Alloc;
  local_50 = 0;
  pAVar4 = (ArenaAllocator *)new<Memory::HeapAllocator>(0x80,alloc,0x350bd0);
  Memory::ArenaAllocator::ArenaAllocator
            (pAVar4,L"Profiler",(PageAllocator *)recycler_local,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->profilerArena = pAVar4;
  pAVar5 = &this->profilerArena->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a0,(type_info *)&Profiler::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextProfiler.cpp"
             ,0x2b);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_a0);
  local_b0 = Memory::ArenaAllocator::Alloc;
  local_a8 = 0;
  pPVar6 = (Profiler *)new<Memory::ArenaAllocator>(0x18d0,(ArenaAllocator *)pAVar5,0x3f67b0);
  Profiler::Profiler(pPVar6,this->profilerArena);
  this->profiler = pPVar6;
  if (local_20 != (Recycler *)0x0) {
    pAVar4 = Memory::Recycler::AddBackgroundProfilerArena(local_20);
    this->backgroundRecyclerProfilerArena = pAVar4;
    pAVar5 = &this->profilerArena->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d8,(type_info *)&Profiler::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextProfiler.cpp"
               ,0x2f);
    pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar5,&local_d8);
    pPVar6 = (Profiler *)new<Memory::ArenaAllocator>(0x18d0,(ArenaAllocator *)pAVar5,0x3f67b0);
    Profiler::Profiler(pPVar6,this->backgroundRecyclerProfilerArena);
    this->backgroundRecyclerProfiler = pPVar6;
    pPVar7 = Memory::ArenaData::GetPageAllocator
                       (&(this->backgroundRecyclerProfiler->alloc->
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                         super_ArenaData);
    (**pPVar7->_vptr_PageAllocatorBase)();
    Profiler::Begin(this->backgroundRecyclerProfiler,AllPhase);
    pPVar7 = Memory::ArenaData::GetPageAllocator
                       (&(this->backgroundRecyclerProfiler->alloc->
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                         super_ArenaData);
    (*pPVar7->_vptr_PageAllocatorBase[1])();
  }
  Profiler::Begin(this->profiler,AllPhase);
  this->recycler = local_20;
  return;
}

Assistant:

void
    ScriptContextProfiler::Initialize(PageAllocator * pageAllocator, Recycler * recycler)
    {
        Assert(!IsInitialized());
        profilerArena = HeapNew(ArenaAllocator, _u("Profiler"), pageAllocator, Js::Throw::OutOfMemory);
        profiler = Anew(profilerArena, Profiler, profilerArena);
        if (recycler)
        {
            backgroundRecyclerProfilerArena = recycler->AddBackgroundProfilerArena();
            backgroundRecyclerProfiler = Anew(profilerArena, Profiler, backgroundRecyclerProfilerArena);

#if DBG
            //backgroundRecyclerProfiler is allocated from background and its guaranteed to assert below if we don't disable thread access check.
            backgroundRecyclerProfiler->alloc->GetPageAllocator()->SetDisableThreadAccessCheck();
#endif

            backgroundRecyclerProfiler->Begin(Js::AllPhase);

#if DBG
            backgroundRecyclerProfiler->alloc->GetPageAllocator()->SetEnableThreadAccessCheck();
#endif
        }
        profiler->Begin(Js::AllPhase);

        this->recycler = recycler;
    }